

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  uint uVar1;
  Instruction *pIVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  
  uVar7 = (ulong)(uint)lastpc;
LAB_00126237:
  iVar9 = (int)uVar7;
  pcVar4 = luaF_getlocalname(p,reg + 1,iVar9);
  *name = pcVar4;
  if (pcVar4 != (char *)0x0) {
    return "local";
  }
  pIVar2 = p->code;
  uVar5 = ((char)"\b\n\n\t\t\b\b\b\b\b"[pIVar2[iVar9] & 0x7f] >> 7) + iVar9;
  uVar8 = 0;
  uVar10 = 0;
  if (0 < (int)uVar5) {
    uVar10 = (ulong)uVar5;
  }
  iVar9 = 0;
  uVar7 = 0xffffffff;
  for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    uVar1 = pIVar2[uVar8];
    uVar13 = uVar1 & 0x7f;
    uVar12 = uVar1 >> 7 & 0xff;
    if (uVar13 - 0x44 < 2) {
LAB_001262f7:
      if ((int)uVar12 <= reg) {
LAB_0012630d:
        uVar7 = uVar8 & 0xffffffff;
        if ((long)uVar8 < (long)iVar9) {
          uVar7 = 0xffffffff;
        }
      }
    }
    else {
      if (uVar13 == 0x4c) {
        uVar12 = uVar12 + 2;
        goto LAB_001262f7;
      }
      if (uVar13 != 0x38) {
        if (uVar13 == 8) {
          if (((int)uVar12 <= reg) && ((uint)reg <= uVar12 + (uVar1 >> 0x10 & 0xff)))
          goto LAB_0012630d;
          goto LAB_00126318;
        }
        if ((uVar12 != reg) || (("\b\n\n\t\t\b\b\b\b\b"[uVar13] & 8) == 0)) goto LAB_00126318;
        goto LAB_0012630d;
      }
      iVar11 = (uVar1 >> 7) + (int)uVar8 + -0xfffffe;
      iVar6 = iVar9;
      if (iVar9 < iVar11) {
        iVar6 = iVar11;
      }
      if (iVar11 <= (int)uVar5) {
        iVar9 = iVar6;
      }
    }
LAB_00126318:
  }
  iVar9 = (int)uVar7;
  if (iVar9 == -1) {
    return (char *)0x0;
  }
  uVar5 = pIVar2[iVar9];
  switch(uVar5 & 0x7f) {
  case 0:
    goto switchD_0012634d_caseD_0;
  default:
    goto switchD_0012634d_caseD_1;
  case 3:
    uVar5 = uVar5 >> 0xf;
    goto LAB_00126457;
  case 4:
    uVar5 = pIVar2[(long)iVar9 + 1] >> 7;
LAB_00126457:
    if (((&p->k->tt_)[uVar5 << 4] & 0xf) == 4) {
      *name = (char *)(*(long *)((long)&p->k->value_ + (ulong)(uVar5 << 4)) + 0x18);
      return "constant";
    }
    return (char *)0x0;
  case 9:
    lVar3 = *(long *)((long)&p->upvalues->name + (ulong)(uVar5 >> 0xc & 0xff0));
    pcVar4 = "?";
    if (lVar3 != 0) {
      pcVar4 = (char *)(lVar3 + 0x18);
    }
    *name = pcVar4;
    return "upvalue";
  case 0xb:
    uVar7 = (ulong)(uVar5 >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar7] & 0xf) == 4) {
      pcVar4 = (char *)(*(long *)((long)&p->k->value_ + uVar7) + 0x18);
    }
    else {
      pcVar4 = "?";
    }
    *name = pcVar4;
    iVar6 = 1;
    goto LAB_001264ea;
  case 0xc:
    rname(p,iVar9,uVar5 >> 0x18,name);
    break;
  case 0xd:
    *name = "integer index";
    return "field";
  case 0xe:
    uVar7 = (ulong)(uVar5 >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar7] & 0xf) == 4) {
      pcVar4 = (char *)(*(long *)((long)&p->k->value_ + uVar7) + 0x18);
    }
    else {
      pcVar4 = "?";
    }
    *name = pcVar4;
    break;
  case 0x14:
    if ((short)uVar5 < 0) {
      uVar7 = (ulong)((uVar5 >> 0x18) << 4);
      if (((&p->k->tt_)[uVar7] & 0xf) == 4) {
        pcVar4 = (char *)(*(long *)((long)&p->k->value_ + uVar7) + 0x18);
      }
      else {
        pcVar4 = "?";
      }
      *name = pcVar4;
    }
    else {
      rname(p,iVar9,uVar5 >> 0x18,name);
    }
    return "method";
  }
  iVar6 = 0;
LAB_001264ea:
  pcVar4 = gxf(p,iVar9,uVar5,iVar6);
  return pcVar4;
switchD_0012634d_caseD_0:
  reg = uVar5 >> 0x10 & 0xff;
  if ((uVar5 >> 7 & 0xff) <= (uint)reg) {
switchD_0012634d_caseD_1:
    return (char *)0x0;
  }
  goto LAB_00126237;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  int pc;
  *name = luaF_getlocalname(p, reg + 1, lastpc);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  pc = findsetreg(p, lastpc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return getobjname(p, pc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return gxf(p, pc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, pc, k, name);
        return gxf(p, pc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return gxf(p, pc, i, 0);
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK:
      case OP_LOADKX: {
        int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                 : GETARG_Ax(p->code[pc + 1]);
        if (ttisstring(&p->k[b])) {
          *name = svalue(&p->k[b]);
          return "constant";
        }
        break;
      }
      case OP_SELF: {
        rkname(p, pc, i, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}